

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar-parser.cpp
# Opt level: O3

uint32_t __thiscall
grammar_parser::generate_symbol_id(grammar_parser *this,parse_state *state,string *base_name)

{
  size_type *psVar1;
  uint __val;
  bool bVar2;
  char cVar3;
  char cVar4;
  undefined8 *puVar5;
  mapped_type *pmVar6;
  uint uVar7;
  ulong uVar8;
  string __str_1;
  __string_type __str;
  key_type local_80;
  ulong *local_60;
  uint local_58;
  undefined4 uStack_54;
  ulong local_50 [2];
  ulong *local_40;
  ulong local_38;
  ulong local_30 [2];
  
  __val = *(uint *)(this + 0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,state,
             (long)&(base_name->_M_dataplus)._M_p + (long)&(state->symbol_ids)._M_t);
  std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
  cVar4 = '\x01';
  if (9 < __val) {
    uVar7 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar7 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00174ee6;
      }
      if (uVar7 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00174ee6;
      }
      if (uVar7 < 10000) goto LAB_00174ee6;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_00174ee6:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_60,local_58,__val);
  local_38 = CONCAT44(uStack_54,local_58) + local_38;
  uVar8 = 0xf;
  if (local_40 != local_30) {
    uVar8 = local_30[0];
  }
  if (uVar8 < local_38) {
    uVar8 = 0xf;
    if (local_60 != local_50) {
      uVar8 = local_50[0];
    }
    if (local_38 <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
      goto LAB_00174f67;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
LAB_00174f67:
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_80.field_2._M_allocated_capacity = *psVar1;
    local_80.field_2._8_8_ = puVar5[3];
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar1;
    local_80._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_80._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)this,&local_80);
  *pmVar6 = __val;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __val;
}

Assistant:

static uint32_t generate_symbol_id(parse_state & state, const std::string & base_name) {
        uint32_t next_id = static_cast<uint32_t>(state.symbol_ids.size());
        state.symbol_ids[base_name + '_' + std::to_string(next_id)] = next_id;
        return next_id;
    }